

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

int __thiscall
DnsStats::SubmitQuery
          (DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start,bool is_response,
          int *qclass,int *qtype)

{
  byte *pbVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar6 = SubmitName(this,packet,length,start,false);
  uVar7 = uVar6 + 4;
  if (length < uVar7) {
    pbVar1 = (byte *)((long)&this->error_flags + 1);
    *pbVar1 = *pbVar1 | 1;
    uVar7 = length;
  }
  else {
    uVar2 = packet[uVar6];
    uVar3 = packet[uVar6 + 1];
    uVar4 = packet[uVar6 + 2];
    uVar5 = packet[uVar6 + 3];
    *qclass = (uint)CONCAT11(uVar4,uVar5);
    *qtype = (uint)CONCAT11(uVar2,uVar3);
    SubmitQueryContent(this,(uint)CONCAT11(uVar2,uVar3),(uint)CONCAT11(uVar4,uVar5),packet,length,
                       start);
  }
  return uVar7;
}

Assistant:

int DnsStats::SubmitQuery(uint8_t * packet, uint32_t length, uint32_t start, bool is_response, int * qclass, int * qtype)
{
    int rrclass = 0;
    int rrtype = 0;
    uint32_t name_start = start;

    /* TODO: if we decide to tabulate parameters in queries, will need
     * to check "is_response" value and controlling flag */
    UNREFERENCED_PARAMETER(is_response);

    start = SubmitName(packet, length, start, false);

    if (start + 4 <= length)
    {
        rrtype = (packet[start] << 8) | packet[start + 1];
        rrclass = (packet[start + 2] << 8) | packet[start + 3];
        start += 4;
        *qclass = rrclass;
        *qtype = rrtype;

        SubmitQueryContent(rrtype, rrclass, packet, length, name_start);
    }
    else
    {
        error_flags |= DNS_REGISTRY_ERROR_FORMAT;
        start = length;
    }

    return start;
}